

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_2::VersionCheck(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  AssemblyGrammar *this;
  DiagnosticStream *pDVar3;
  ExtensionSet *extensions;
  ExtensionSet *extensions_00;
  string local_a28;
  uint local_a08;
  uint local_a04;
  char *local_a00;
  DiagnosticStream local_9f8;
  string local_820;
  char *local_800;
  DiagnosticStream local_7f8;
  uint local_620;
  uint local_61c;
  char *local_618;
  DiagnosticStream local_610;
  undefined4 local_434;
  char *local_430;
  DiagnosticStream local_428;
  undefined1 local_250 [8];
  ExtensionSet exts;
  uint local_228;
  uint uStack_224;
  bool capability_check_is_sufficient;
  char *local_220;
  DiagnosticStream local_218;
  uint32_t local_40;
  uint local_3c;
  uint32_t module_version;
  uint32_t last_version;
  uint32_t min_version;
  spv_result_t r;
  spv_opcode_desc inst_desc;
  Instruction *pIStack_20;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  inst_desc._4_4_ = Instruction::opcode(inst);
  this = ValidationState_t::grammar((ValidationState_t *)inst_local);
  last_version = AssemblyGrammar::lookupOpcode(this,inst_desc._4_4_,(spv_opcode_desc *)&min_version)
  ;
  if (last_version != SPV_SUCCESS) {
    __assert_fail("r == SPV_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_instruction.cpp"
                  ,0x119,
                  "spv_result_t spvtools::val::(anonymous namespace)::VersionCheck(ValidationState_t &, const Instruction *)"
                 );
  }
  module_version = _min_version->minVersion;
  local_3c = _min_version->lastVersion;
  local_40 = ValidationState_t::version((ValidationState_t *)inst_local);
  if (local_3c < local_40) {
    ValidationState_t::diag
              (&local_218,(ValidationState_t *)inst_local,SPV_ERROR_WRONG_VERSION,pIStack_20);
    local_220 = spvOpcodeString(inst_desc._4_4_);
    pDVar3 = DiagnosticStream::operator<<(&local_218,&local_220);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [26])0x3e0e03);
    uStack_224 = local_3c >> 0x10 & 0xff;
    pDVar3 = DiagnosticStream::operator<<(pDVar3,&stack0xfffffffffffffddc);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0x3cdc5b);
    local_228 = local_3c >> 8 & 0xff;
    pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_228);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [12])" or earlier");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream(&local_218);
    return __local._4_4_;
  }
  OVar2 = Instruction::opcode(pIStack_20);
  exts.size_._7_1_ = OVar2 != OpTerminateInvocation;
  if (((bool)exts.size_._7_1_) && (_min_version->numCapabilities != 0)) {
    return SPV_SUCCESS;
  }
  EnumSet<spvtools::Extension>::EnumSet
            ((EnumSet<spvtools::Extension> *)local_250,_min_version->numExtensions,
             _min_version->extensions);
  bVar1 = EnumSet<spvtools::Extension>::empty((EnumSet<spvtools::Extension> *)local_250);
  if (bVar1) {
    if (module_version == 0xffffffff) {
      ValidationState_t::diag
                (&local_428,(ValidationState_t *)inst_local,SPV_ERROR_WRONG_VERSION,pIStack_20);
      local_430 = spvOpcodeString(inst_desc._4_4_);
      pDVar3 = DiagnosticStream::operator<<(&local_428,&local_430);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [29])" is reserved for future use.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_428);
      goto LAB_00311f7e;
    }
    if (local_40 < module_version) {
      ValidationState_t::diag
                (&local_610,(ValidationState_t *)inst_local,SPV_ERROR_WRONG_VERSION,pIStack_20);
      local_618 = spvOpcodeString(inst_desc._4_4_);
      pDVar3 = DiagnosticStream::operator<<(&local_610,&local_618);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [26])0x3e0e03);
      local_61c = module_version >> 0x10 & 0xff;
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_61c);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0x3cdc5b);
      local_620 = module_version >> 8 & 0xff;
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_620);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [13])" at minimum.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_610);
      goto LAB_00311f7e;
    }
  }
  else {
    bVar1 = ValidationState_t::HasAnyOfExtensions
                      ((ValidationState_t *)inst_local,(ExtensionSet *)local_250);
    if (!bVar1) {
      if (module_version == 0xffffffff) {
        ValidationState_t::diag
                  (&local_7f8,(ValidationState_t *)inst_local,SPV_ERROR_MISSING_EXTENSION,pIStack_20
                  );
        local_800 = spvOpcodeString(inst_desc._4_4_);
        pDVar3 = DiagnosticStream::operator<<(&local_7f8,&local_800);
        pDVar3 = DiagnosticStream::operator<<
                           (pDVar3,(char (*) [44])" requires one of the following extensions: ");
        ExtensionSetToString_abi_cxx11_(&local_820,(spvtools *)local_250,extensions);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_820);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        std::__cxx11::string::~string((string *)&local_820);
        DiagnosticStream::~DiagnosticStream(&local_7f8);
        goto LAB_00311f7e;
      }
      if (local_40 < module_version) {
        ValidationState_t::diag
                  (&local_9f8,(ValidationState_t *)inst_local,SPV_ERROR_WRONG_VERSION,pIStack_20);
        local_a00 = spvOpcodeString(inst_desc._4_4_);
        pDVar3 = DiagnosticStream::operator<<(&local_9f8,&local_a00);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [26])0x3e0e03);
        local_a04 = module_version >> 0x10 & 0xff;
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_a04);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0x3cdc5b);
        local_a08 = module_version >> 8 & 0xff;
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_a08);
        pDVar3 = DiagnosticStream::operator<<
                           (pDVar3,(char (*) [49])" at minimum or one of the following extensions: "
                           );
        ExtensionSetToString_abi_cxx11_(&local_a28,(spvtools *)local_250,extensions_00);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_a28);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        std::__cxx11::string::~string((string *)&local_a28);
        DiagnosticStream::~DiagnosticStream(&local_9f8);
        goto LAB_00311f7e;
      }
    }
  }
  __local._4_4_ = SPV_SUCCESS;
LAB_00311f7e:
  local_434 = 1;
  EnumSet<spvtools::Extension>::~EnumSet((EnumSet<spvtools::Extension> *)local_250);
  return __local._4_4_;
}

Assistant:

spv_result_t VersionCheck(ValidationState_t& _, const Instruction* inst) {
  const auto opcode = inst->opcode();
  spv_opcode_desc inst_desc;
  const spv_result_t r = _.grammar().lookupOpcode(opcode, &inst_desc);
  assert(r == SPV_SUCCESS);
  (void)r;

  const auto min_version = inst_desc->minVersion;
  const auto last_version = inst_desc->lastVersion;
  const auto module_version = _.version();

  if (last_version < module_version) {
    return _.diag(SPV_ERROR_WRONG_VERSION, inst)
           << spvOpcodeString(opcode) << " requires SPIR-V version "
           << SPV_SPIRV_VERSION_MAJOR_PART(last_version) << "."
           << SPV_SPIRV_VERSION_MINOR_PART(last_version) << " or earlier";
  }

  // OpTerminateInvocation is special because it is enabled by Shader
  // capability, but also requires an extension and/or version check.
  const bool capability_check_is_sufficient =
      inst->opcode() != spv::Op::OpTerminateInvocation;

  if (capability_check_is_sufficient && (inst_desc->numCapabilities > 0u)) {
    // We already checked that the direct capability dependency has been
    // satisfied. We don't need to check any further.
    return SPV_SUCCESS;
  }

  ExtensionSet exts(inst_desc->numExtensions, inst_desc->extensions);
  if (exts.empty()) {
    // If no extensions can enable this instruction, then emit error
    // messages only concerning core SPIR-V versions if errors happen.
    if (min_version == ~0u) {
      return _.diag(SPV_ERROR_WRONG_VERSION, inst)
             << spvOpcodeString(opcode) << " is reserved for future use.";
    }

    if (module_version < min_version) {
      return _.diag(SPV_ERROR_WRONG_VERSION, inst)
             << spvOpcodeString(opcode) << " requires SPIR-V version "
             << SPV_SPIRV_VERSION_MAJOR_PART(min_version) << "."
             << SPV_SPIRV_VERSION_MINOR_PART(min_version) << " at minimum.";
    }
  } else if (!_.HasAnyOfExtensions(exts)) {
    // Otherwise, we only error out when no enabling extensions are
    // registered.
    if (min_version == ~0u) {
      return _.diag(SPV_ERROR_MISSING_EXTENSION, inst)
             << spvOpcodeString(opcode)
             << " requires one of the following extensions: "
             << ExtensionSetToString(exts);
    }

    if (module_version < min_version) {
      return _.diag(SPV_ERROR_WRONG_VERSION, inst)
             << spvOpcodeString(opcode) << " requires SPIR-V version "
             << SPV_SPIRV_VERSION_MAJOR_PART(min_version) << "."
             << SPV_SPIRV_VERSION_MINOR_PART(min_version)
             << " at minimum or one of the following extensions: "
             << ExtensionSetToString(exts);
    }
  }

  return SPV_SUCCESS;
}